

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix<Rational> __thiscall
Matrix<Rational>::joinHorizontal(Matrix<Rational> *this,Matrix<Rational> *a)

{
  undefined8 uVar1;
  uint *in_RDX;
  Rational *extraout_RDX;
  Rational *extraout_RDX_00;
  Rational *pRVar2;
  Rational *extraout_RDX_01;
  Matrix<Rational> *in_RSI;
  undefined8 in_RDI;
  Matrix<Rational> MVar3;
  uint j_1;
  uint j;
  uint i;
  Matrix<Rational> *res;
  Rational *in_stack_ffffffffffffff48;
  row_t in_stack_ffffffffffffff50;
  MatrixRow<Rational_&> local_58;
  MatrixRow<const_Rational_&> local_50;
  uint local_44;
  MatrixRow<Rational_&> local_40;
  MatrixRow<const_Rational_&> local_38;
  uint local_30;
  uint local_2c;
  undefined1 local_25;
  uint *local_18;
  
  if (in_RSI->M == *in_RDX) {
    local_25 = 0;
    local_18 = in_RDX;
    Matrix(in_RSI,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
    pRVar2 = extraout_RDX;
    for (local_2c = 0; local_2c < in_RSI->M; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < in_RSI->N; local_30 = local_30 + 1) {
        local_38.arr = (Rational *)operator[](in_stack_ffffffffffffff48,0);
        MatrixRow<const_Rational_&>::operator[](&local_38,local_30);
        local_40.arr = (Rational *)operator[](in_stack_ffffffffffffff48,0);
        MatrixRow<Rational_&>::operator[](&local_40,local_30);
        Rational::operator=(in_stack_ffffffffffffff50.arr,in_stack_ffffffffffffff48);
        pRVar2 = extraout_RDX_00;
      }
      for (local_44 = 0; local_44 < local_18[1]; local_44 = local_44 + 1) {
        local_50.arr = (Rational *)operator[](in_stack_ffffffffffffff48,0);
        MatrixRow<const_Rational_&>::operator[](&local_50,local_44);
        in_stack_ffffffffffffff50 = operator[](in_stack_ffffffffffffff48,0);
        local_58.arr = in_stack_ffffffffffffff50.arr;
        in_stack_ffffffffffffff48 =
             MatrixRow<Rational_&>::operator[](&local_58,in_RSI->N + local_44);
        Rational::operator=(in_stack_ffffffffffffff50.arr,in_stack_ffffffffffffff48);
        pRVar2 = extraout_RDX_01;
      }
    }
    MVar3.arr = pRVar2;
    MVar3.M = (int)in_RDI;
    MVar3.N = (int)((ulong)in_RDI >> 0x20);
    return MVar3;
  }
  uVar1 = __cxa_allocate_exception(0x10);
  matrix_error::runtime_error
            ((matrix_error *)in_stack_ffffffffffffff50.arr,(char *)in_stack_ffffffffffffff48);
  __cxa_throw(uVar1,&matrix_error::typeinfo,matrix_error::~matrix_error);
}

Assistant:

const Matrix<Field> Matrix<Field>::joinHorizontal(const Matrix &a) const
{
    if(M != a.M)
    {
        throw matrix_error("Trying to join matrices of different height");
    }
    Matrix res(M, N + a.N);
    for(unsigned i = 0; i < M; i++)
    {
        for(unsigned j = 0; j < N; j++)
        {
            res[i][j] = (*this)[i][j];
        }
        for(unsigned j = 0; j < a.N; j++)
        {
            res[i][N + j] = a[i][j];
        }
    }
    return res;
}